

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

void verifyProcrustes<float>
               (vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *from,
               vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *to)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pVVar4;
  Vec3<float> *from_00;
  Vec3<float> *to_00;
  pointer pVVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  pointer weights_00;
  int i;
  undefined1 *puVar8;
  bool bVar9;
  int j;
  long lVar10;
  long lVar11;
  ulong uVar12;
  Vec3 *pVVar13;
  double (*padVar14) [4];
  Vec3 *pVVar15;
  double (*xform) [4];
  size_type __n;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  double dVar30;
  double dVar31;
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar36;
  int iVar39;
  double dVar37;
  double dVar38;
  double dVar40;
  float fVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  vector<float,_std::allocator<float>_> weights;
  M44d m;
  Rand48 rand;
  M33d upperLeft;
  M44d ms;
  M44d m1;
  Matrix33<double> tmp;
  M44d m2;
  vector<float,_std::allocator<float>_> local_460;
  M44d local_448;
  pointer local_3c0;
  pointer local_3b8;
  ushort local_3ae [3];
  double local_3a8;
  double dStack_3a0;
  double local_398;
  double local_380;
  double local_378;
  double local_370 [9];
  undefined1 local_328 [24];
  double dStack_310;
  undefined1 local_308 [16];
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  undefined1 local_2d8 [16];
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  Euler<double> local_2a8;
  double local_288;
  double dStack_280;
  M44d local_278;
  Matrix44<double> local_1f8;
  allocator_type local_178 [128];
  undefined1 local_f8 [16];
  double local_e8;
  double local_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  Vec3 local_b0 [128];
  
  pVVar4 = (from->
           super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_3b8 = (from->
              super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  __n = ((long)local_3b8 - (long)pVVar4 >> 2) * -0x5555555555555555;
  std::vector<float,_std::allocator<float>_>::vector(&local_460,__n,local_178);
  auVar7 = _DAT_001602a0;
  if ((long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar10 = (long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar10 = lVar10 + (ulong)(lVar10 == 0);
    lVar11 = lVar10 + -1;
    auVar19._8_4_ = (int)lVar11;
    auVar19._0_8_ = lVar11;
    auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar19 = auVar19 ^ _DAT_001602a0;
    auVar27 = _DAT_00169da0;
    auVar22 = _DAT_00169db0;
    do {
      auVar32 = auVar22 ^ auVar7;
      iVar21 = auVar19._4_4_;
      if ((bool)(~(auVar32._4_4_ == iVar21 && auVar19._0_4_ < auVar32._0_4_ ||
                  iVar21 < auVar32._4_4_) & 1)) {
        local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12] = 1.0;
      }
      if ((auVar32._12_4_ != auVar19._12_4_ || auVar32._8_4_ <= auVar19._8_4_) &&
          auVar32._12_4_ <= auVar19._12_4_) {
        local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12 + 1] = 1.0;
      }
      auVar32 = auVar27 ^ auVar7;
      iVar39 = auVar32._4_4_;
      if (iVar39 <= iVar21 && (iVar39 != iVar21 || auVar32._0_4_ <= auVar19._0_4_)) {
        local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12 + 2] = 1.0;
        local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12 + 3] = 1.0;
      }
      uVar12 = uVar12 + 4;
      lVar11 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar11 + 4;
      lVar11 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar11 + 4;
    } while ((lVar10 + 3U & 0xfffffffffffffffc) != uVar12);
  }
  pVVar13 = (Vec3 *)local_178;
  bVar9 = SUB81(__n,0);
  Imath_3_2::procrustesRotationAndTranslation<float>
            (pVVar13,(Vec3 *)(from->
                             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
             (ulong)(to->
                    super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,bVar9);
  pVVar15 = local_b0;
  Imath_3_2::procrustesRotationAndTranslation<float>
            (pVVar15,(Vec3 *)(from->
                             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
             &((to->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start)->x,
             (ulong)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,bVar9);
  auVar7 = _DAT_001602a0;
  lVar10 = 0;
  do {
    lVar11 = 0;
    do {
      if (0.0003452669770922512 <=
          ABS(*(double *)(pVVar13 + lVar11 * 8) - *(double *)(pVVar15 + lVar11 * 8))) {
        __assert_fail("std::abs (m1[i][j] - m2[i][j]) < eps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                      ,0x9f,
                      "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                     );
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    lVar10 = lVar10 + 1;
    pVVar15 = pVVar15 + 0x20;
    pVVar13 = pVVar13 + 0x20;
  } while (lVar10 != 4);
  if ((long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar10 = (long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar10 = lVar10 + (ulong)(lVar10 == 0);
    lVar11 = lVar10 + -1;
    auVar20._8_4_ = (int)lVar11;
    auVar20._0_8_ = lVar11;
    auVar20._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar20 = auVar20 ^ _DAT_001602a0;
    auVar24._8_4_ = 0xffffffff;
    auVar24._0_8_ = 0xffffffffffffffff;
    auVar24._12_4_ = 0xffffffff;
    auVar32 = _DAT_00169db0;
    do {
      auVar27 = auVar32 ^ auVar7;
      auVar33._0_4_ = -(uint)(auVar20._0_4_ < auVar27._0_4_);
      auVar33._4_4_ = -(uint)(auVar20._4_4_ < auVar27._4_4_);
      auVar33._8_4_ = -(uint)(auVar20._8_4_ < auVar27._8_4_);
      auVar33._12_4_ = -(uint)(auVar20._12_4_ < auVar27._12_4_);
      auVar28._4_4_ = -(uint)(auVar27._4_4_ == auVar20._4_4_);
      auVar28._12_4_ = -(uint)(auVar27._12_4_ == auVar20._12_4_);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar34._4_4_ = auVar33._4_4_;
      auVar34._0_4_ = auVar33._4_4_;
      auVar34._8_4_ = auVar33._12_4_;
      auVar34._12_4_ = auVar33._12_4_;
      auVar34 = auVar34 | auVar28 & auVar33;
      lVar11 = auVar32._8_8_;
      if ((~auVar34._0_4_ & 1) != 0) {
        local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12] = (float)(auVar32._0_8_ + 1);
      }
      if (((auVar34 ^ auVar24) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12 + 1] = (float)(ulong)(lVar11 - auVar24._8_8_);
      }
      uVar12 = uVar12 + 2;
      auVar32._0_8_ = auVar32._0_8_ + 2;
      auVar32._8_8_ = lVar11 + 2;
    } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar12);
  }
  pVVar13 = (Vec3 *)&local_448;
  local_3c0 = pVVar4;
  Imath_3_2::procrustesRotationAndTranslation<float>
            (pVVar13,(Vec3 *)(from->
                             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
             &((to->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start)->x,
             (ulong)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,bVar9);
  pVVar15 = (Vec3 *)&local_278;
  Imath_3_2::procrustesRotationAndTranslation<float>
            (pVVar15,(Vec3 *)(from->
                             super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
             &((to->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start)->x,
             (ulong)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,bVar9);
  dVar16 = 0.0;
  if ((local_448.x[0][3] != 0.0) || (NAN(local_448.x[0][3]))) {
    dVar16 = 0.0 - local_448.x[0][3] *
                   ((local_448.x[2][0] * local_448.x[3][1] - local_448.x[3][0] * local_448.x[2][1])
                    * local_448.x[1][2] +
                   (local_448.x[2][1] * local_448.x[3][2] - local_448.x[3][1] * local_448.x[2][2]) *
                   local_448.x[1][0] +
                   (local_448.x[2][2] * local_448.x[3][0] - local_448.x[3][2] * local_448.x[2][0]) *
                   local_448.x[1][1]);
  }
  if ((local_448.x[1][3] != 0.0) || (NAN(local_448.x[1][3]))) {
    dVar16 = dVar16 + local_448.x[1][3] *
                      ((local_448.x[2][0] * local_448.x[3][1] -
                       local_448.x[3][0] * local_448.x[2][1]) * local_448.x[0][2] +
                      (local_448.x[2][1] * local_448.x[3][2] - local_448.x[3][1] * local_448.x[2][2]
                      ) * local_448.x[0][0] +
                      (local_448.x[2][2] * local_448.x[3][0] - local_448.x[3][2] * local_448.x[2][0]
                      ) * local_448.x[0][1]);
  }
  if ((local_448.x[2][3] != 0.0) || (NAN(local_448.x[2][3]))) {
    dVar16 = dVar16 - local_448.x[2][3] *
                      ((local_448.x[1][0] * local_448.x[3][1] -
                       local_448.x[3][0] * local_448.x[1][1]) * local_448.x[0][2] +
                      (local_448.x[1][1] * local_448.x[3][2] - local_448.x[3][1] * local_448.x[1][2]
                      ) * local_448.x[0][0] +
                      (local_448.x[1][2] * local_448.x[3][0] - local_448.x[3][2] * local_448.x[1][0]
                      ) * local_448.x[0][1]);
  }
  if ((local_448.x[3][3] != 0.0) || (NAN(local_448.x[3][3]))) {
    dVar16 = dVar16 + local_448.x[3][3] *
                      ((local_448.x[1][0] * local_448.x[2][1] -
                       local_448.x[2][0] * local_448.x[1][1]) * local_448.x[0][2] +
                      (local_448.x[1][1] * local_448.x[2][2] - local_448.x[2][1] * local_448.x[1][2]
                      ) * local_448.x[0][0] +
                      (local_448.x[1][2] * local_448.x[2][0] - local_448.x[2][2] * local_448.x[1][0]
                      ) * local_448.x[0][1]);
  }
  if (0.00034526698 <= ABS((float)dVar16 + -1.0)) {
    __assert_fail("std::abs (det - T (1)) < eps",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0xae,
                  "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                 );
  }
  local_370[0] = 1.0;
  local_370[1] = 0.0;
  local_370[2] = 0.0;
  lVar10 = 0;
  local_370[3] = 0.0;
  local_370[4] = 1.0;
  local_370[5] = 0.0;
  local_370[6] = 0.0;
  local_370[7] = 0.0;
  local_370[8] = 1.0;
  do {
    *(undefined8 *)((long)local_370 + lVar10 + 0x10) = *(undefined8 *)(pVVar13 + 0x10);
    uVar6 = *(undefined8 *)(pVVar13 + 8);
    *(undefined8 *)((long)local_370 + lVar10) = *(undefined8 *)pVVar13;
    *(undefined8 *)((long)local_370 + lVar10 + 8) = uVar6;
    pVVar13 = pVVar13 + 0x20;
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x48);
  local_e0 = local_370[5] * local_370[2] + local_370[3] * local_370[0] + local_370[4] * local_370[1]
  ;
  puVar8 = local_f8;
  local_f8._8_4_ = SUB84(local_e0,0);
  local_f8._0_8_ =
       local_370[2] * local_370[2] + local_370[0] * local_370[0] + local_370[1] * local_370[1];
  local_f8._12_4_ = (int)((ulong)local_e0 >> 0x20);
  local_e8 = local_370[2] * local_370[8] + local_370[0] * local_370[6] + local_370[1] * local_370[7]
  ;
  dStack_d0 = local_370[8] * local_370[5] +
              local_370[6] * local_370[3] + local_370[7] * local_370[4];
  local_d8 = local_370[5] * local_370[5] + local_370[3] * local_370[3] + local_370[4] * local_370[4]
  ;
  local_c8 = local_e8;
  local_c0 = dStack_d0;
  local_b8 = local_370[8] * local_370[8] + local_370[6] * local_370[6] + local_370[7] * local_370[7]
  ;
  lVar10 = 0;
  do {
    lVar11 = 0;
    do {
      dVar16 = 1.0;
      if (lVar10 != lVar11) {
        dVar16 = 0.0;
      }
      if (0.0003452669770922512 <= ABS(*(double *)(puVar8 + lVar11 * 8) - dVar16)) {
        __assert_fail("std::abs (product[i][j] - expected) < eps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                      ,0xbc,
                      "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                     );
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar10 = lVar10 + 1;
    puVar8 = puVar8 + 0x18;
  } while (lVar10 != 3);
  local_3ae[0] = 0x52fa;
  local_3ae[1] = 0x1027;
  local_3ae[2] = 0x52fa;
  dVar16 = 4.94065645841247e-323;
  padVar14 = (double (*) [4])local_328;
  do {
    dVar17 = (double)Imath_3_2::erand48(local_3ae);
    local_398 = (double)Imath_3_2::erand48(local_3ae);
    local_2a8.super_Vec3<double>.z = (double)Imath_3_2::erand48(local_3ae);
    weights_00 = local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_2a8.super_Vec3<double>.y = local_398 * 0.001;
    local_2a8.super_Vec3<double>.z = local_2a8.super_Vec3<double>.z * 0.001;
    local_2a8._24_1_ = local_2a8._24_1_ & 0xe0 | 5;
    from_00 = (from->
              super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    to_00 = (to->
            super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
    local_2a8.super_Vec3<double>.x = dVar17 * 0.001;
    Imath_3_2::Euler<double>::toMatrix44(&local_1f8,&local_2a8);
    local_328._0_8_ =
         local_448.x[0][3] * local_1f8.x[3][0] +
         local_448.x[0][2] * local_1f8.x[2][0] +
         local_448.x[0][0] * local_1f8.x[0][0] + local_448.x[0][1] * local_1f8.x[1][0];
    local_328._8_8_ =
         local_448.x[0][3] * local_1f8.x[3][1] +
         local_448.x[0][2] * local_1f8.x[2][1] +
         local_448.x[0][0] * local_1f8.x[0][1] + local_448.x[0][1] * local_1f8.x[1][1];
    dVar17 = local_448.x[0][3] * local_1f8.x[3][3] +
             local_448.x[0][2] * local_1f8.x[2][3] +
             local_448.x[0][0] * local_1f8.x[0][3] + local_448.x[0][1] * local_1f8.x[1][3];
    unique0x100006ce = SUB84(dVar17,0);
    local_328._16_8_ =
         local_448.x[0][3] * local_1f8.x[3][2] +
         local_448.x[0][2] * local_1f8.x[2][2] +
         local_448.x[0][0] * local_1f8.x[0][2] + local_448.x[0][1] * local_1f8.x[1][2];
    unique0x100006d2 = (int)((ulong)dVar17 >> 0x20);
    dVar17 = local_448.x[1][3] * local_1f8.x[3][1] +
             local_448.x[1][2] * local_1f8.x[2][1] +
             local_448.x[1][0] * local_1f8.x[0][1] + local_1f8.x[1][1] * local_448.x[1][1];
    local_308._8_4_ = SUB84(dVar17,0);
    local_308._0_8_ =
         local_448.x[1][3] * local_1f8.x[3][0] +
         local_448.x[1][2] * local_1f8.x[2][0] +
         local_448.x[1][0] * local_1f8.x[0][0] + local_1f8.x[1][0] * local_448.x[1][1];
    local_308._12_4_ = (int)((ulong)dVar17 >> 0x20);
    local_2f8 = local_448.x[1][3] * local_1f8.x[3][2] +
                local_448.x[1][2] * local_1f8.x[2][2] +
                local_448.x[1][0] * local_1f8.x[0][2] + local_448.x[1][1] * local_1f8.x[1][2];
    dStack_2f0 = local_448.x[1][3] * local_1f8.x[3][3] +
                 local_448.x[1][2] * local_1f8.x[2][3] +
                 local_448.x[1][0] * local_1f8.x[0][3] + local_448.x[1][1] * local_1f8.x[1][3];
    local_2e8 = local_448.x[2][3] * local_1f8.x[3][0] +
                local_448.x[2][2] * local_1f8.x[2][0] +
                local_448.x[2][0] * local_1f8.x[0][0] + local_1f8.x[1][0] * local_448.x[2][1];
    dStack_2e0 = local_448.x[2][3] * local_1f8.x[3][1] +
                 local_448.x[2][2] * local_1f8.x[2][1] +
                 local_448.x[2][0] * local_1f8.x[0][1] + local_1f8.x[1][1] * local_448.x[2][1];
    dVar17 = local_448.x[2][3] * local_1f8.x[3][3] +
             local_448.x[2][2] * local_1f8.x[2][3] +
             local_448.x[2][0] * local_1f8.x[0][3] + local_448.x[2][1] * local_1f8.x[1][3];
    local_2d8._8_4_ = SUB84(dVar17,0);
    local_2d8._0_8_ =
         local_448.x[2][3] * local_1f8.x[3][2] +
         local_448.x[2][2] * local_1f8.x[2][2] +
         local_448.x[2][0] * local_1f8.x[0][2] + local_448.x[2][1] * local_1f8.x[1][2];
    local_2d8._12_4_ = (int)((ulong)dVar17 >> 0x20);
    local_2c8 = local_1f8.x[3][0] * local_448.x[3][3] +
                local_1f8.x[2][0] * local_448.x[3][2] +
                local_1f8.x[0][0] * local_448.x[3][0] + local_1f8.x[1][0] * local_448.x[3][1];
    dStack_2c0 = local_1f8.x[3][1] * local_448.x[3][3] +
                 local_1f8.x[2][1] * local_448.x[3][2] +
                 local_1f8.x[0][1] * local_448.x[3][0] + local_1f8.x[1][1] * local_448.x[3][1];
    local_2b8 = local_448.x[3][3] * local_1f8.x[3][2] +
                local_448.x[3][2] * local_1f8.x[2][2] +
                local_448.x[3][0] * local_1f8.x[0][2] + local_448.x[3][1] * local_1f8.x[1][2];
    dStack_2b0 = local_448.x[3][3] * local_1f8.x[3][3] +
                 local_448.x[3][2] * local_1f8.x[2][3] +
                 local_448.x[3][0] * local_1f8.x[0][3] + local_448.x[3][1] * local_1f8.x[1][3];
    dVar17 = procrustesError<float>(from_00,to_00,weights_00,__n,(M44d *)padVar14);
    dVar18 = procrustesError<float>
                       ((from->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        (to->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,__n,&local_448);
    if (dVar17 <= dVar18) {
      __assert_fail("procrustesError ( &from[0], &to[0], &weights[0], n, m * diffRot.toMatrix44 ()) > procrustesError (&from[0], &to[0], &weights[0], n, m)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0xcf,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
    local_398 = dVar16;
    dVar16 = (double)Imath_3_2::erand48(local_3ae);
    local_3a8 = (double)Imath_3_2::erand48(local_3ae);
    dVar17 = (double)Imath_3_2::erand48(local_3ae);
    dStack_3a0 = local_3a8 * 0.001;
    dVar18 = dStack_3a0 * 0.0;
    local_3a8 = dVar16 * 0.001 + dVar18;
    dVar23 = dVar16 * 0.001 * 0.0;
    dStack_3a0 = dStack_3a0 + dVar23;
    dVar23 = dVar23 + dVar18;
    dVar37 = dVar17 * 0.001 * 0.0;
    dVar25 = local_448.x[0][0] * 0.0 + local_448.x[0][1] * 0.0;
    dVar18 = local_448.x[0][2] * 0.0;
    dVar30 = local_448.x[1][0] * 0.0 + local_448.x[1][1] * 0.0;
    dVar26 = local_448.x[1][2] * 0.0;
    dVar42 = local_448.x[2][0] * 0.0 + local_448.x[2][1] * 0.0;
    dVar31 = local_448.x[2][2] * 0.0;
    dVar44 = local_448.x[3][0] * 0.0 + local_448.x[3][1] * 0.0;
    dVar43 = local_448.x[3][2] * 0.0;
    dVar38 = dVar37 + local_3a8 + 0.0;
    dVar40 = dVar37 + dStack_3a0 + 0.0;
    local_328._0_8_ =
         local_448.x[0][3] * dVar38 + dVar18 + local_448.x[0][0] + local_448.x[0][1] * 0.0;
    local_328._8_8_ =
         local_448.x[0][3] * dVar40 + dVar18 + local_448.x[0][1] + local_448.x[0][0] * 0.0;
    dVar16 = dVar23 + dVar17 * 0.001 + 0.0;
    dVar17 = dVar23 + dVar37 + 1.0;
    dStack_310 = local_448.x[0][3] * dVar17 + dVar25 + dVar18;
    local_328._16_8_ = local_448.x[0][3] * dVar16 + local_448.x[0][2] + dVar25;
    local_308._8_8_ =
         local_448.x[1][3] * dVar40 + dVar26 + local_448.x[1][1] + local_448.x[1][0] * 0.0;
    local_308._0_8_ =
         local_448.x[1][3] * dVar38 + dVar26 + local_448.x[1][0] + local_448.x[1][1] * 0.0;
    local_2f8 = local_448.x[1][3] * dVar16 + local_448.x[1][2] + dVar30;
    dStack_2f0 = local_448.x[1][3] * dVar17 + dVar30 + dVar26;
    local_2e8 = local_448.x[2][3] * dVar38 + dVar31 + local_448.x[2][0] + local_448.x[2][1] * 0.0;
    dStack_2e0 = local_448.x[2][3] * dVar40 + dVar31 + local_448.x[2][1] + local_448.x[2][0] * 0.0;
    local_2d8._8_8_ = local_448.x[2][3] * dVar17 + dVar42 + dVar31;
    local_2d8._0_8_ = local_448.x[2][3] * dVar16 + local_448.x[2][2] + dVar42;
    local_2c8 = dVar38 * local_448.x[3][3] + dVar43 + local_448.x[3][0] + local_448.x[3][1] * 0.0;
    dStack_2c0 = dVar40 * local_448.x[3][3] + dVar43 + local_448.x[3][1] + local_448.x[3][0] * 0.0;
    local_2b8 = local_448.x[3][3] * dVar16 + local_448.x[3][2] + dVar44;
    dStack_2b0 = local_448.x[3][3] * dVar17 + dVar44 + dVar43;
    dVar16 = procrustesError<float>
                       ((from->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        (to->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,__n,(M44d *)padVar14);
    dVar17 = procrustesError<float>
                       ((from->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        (to->
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                        local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,__n,&local_448);
    if (dVar16 <= dVar17) {
      __assert_fail("procrustesError ( &from[0], &to[0], &weights[0], n, m * translateMatrix) > procrustesError (&from[0], &to[0], &weights[0], n, m)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0xdb,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
    dVar16 = (double)((long)local_398 + -1);
  } while (dVar16 != 0.0);
  local_328._0_8_ = local_278.x[0][0];
  local_328._8_8_ = local_278.x[0][1];
  local_2f8 = local_278.x[1][2];
  dStack_2f0 = local_278.x[1][3];
  local_2e8 = local_278.x[2][0];
  dStack_2e0 = local_278.x[2][1];
  local_2c8 = local_278.x[3][0];
  dStack_2c0 = local_278.x[3][1];
  local_2b8 = local_278.x[3][2];
  dStack_2b0 = local_278.x[3][3];
  lVar10 = 0;
  do {
    lVar11 = 0;
    do {
      (*(double (*) [4])*padVar14)[lVar11] = *(double *)(pVVar15 + lVar11 * 8) * 1.001;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar10 = lVar10 + 1;
    padVar14 = padVar14 + 1;
    pVVar15 = pVVar15 + 0x20;
  } while (lVar10 != 3);
  padVar14 = (double (*) [4])local_328;
  dVar16 = procrustesError<float>
                     ((from->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (to->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,__n,(M44d *)padVar14);
  xform = (double (*) [4])&local_278;
  dVar17 = procrustesError<float>
                     ((from->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (to->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,__n,(M44d *)xform);
  pVVar4 = local_3c0;
  if (dVar16 <= dVar17) {
    __assert_fail("procrustesError (&from[0], &to[0], &weights[0], n, newMat) > procrustesError (&from[0], &to[0], &weights[0], n, ms)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0xe6,
                  "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                 );
  }
  lVar10 = 0;
  do {
    lVar11 = 0;
    do {
      (*(double (*) [4])*padVar14)[lVar11] = (*(double (*) [4])*xform)[lVar11] * 0.999;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar10 = lVar10 + 1;
    padVar14 = padVar14 + 1;
    xform = xform + 1;
  } while (lVar10 != 3);
  dVar16 = procrustesError<float>
                     ((from->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (to->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,__n,(M44d *)local_328);
  dVar17 = procrustesError<float>
                     ((from->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (to->
                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,__n,&local_278);
  if (dVar17 < dVar16) {
    if (local_3b8 == pVVar4) {
      dVar16 = 0.0;
      dVar18 = 0.0;
      dVar17 = 0.0;
      dVar25 = 0.0;
      dVar26 = 0.0;
      dVar23 = 0.0;
    }
    else {
      pVVar4 = (from->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      local_398 = local_448.x[1][0];
      local_3a8 = local_448.x[2][0];
      local_3b8 = (pointer)local_448.x[3][0];
      local_3c0 = (pointer)local_448.x[1][1];
      local_378 = local_448.x[2][1];
      local_380 = local_448.x[3][1];
      local_288 = local_448.x[0][2];
      dStack_280 = local_448.x[0][3];
      pVVar5 = (to->
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      dVar23 = 0.0;
      lVar10 = 2;
      lVar11 = 0;
      dVar26 = 0.0;
      dVar25 = 0.0;
      dVar17 = 0.0;
      dVar18 = 0.0;
      dVar16 = 0.0;
      do {
        dVar37 = (double)*(float *)((long)pVVar4 + lVar10 * 4 + -8);
        dVar31 = (double)*(float *)((long)pVVar4 + lVar10 * 4 + -4);
        dVar30 = (double)(&pVVar4->x)[lVar10];
        fVar35 = (float)(dVar30 * local_448.x[2][3] +
                         dVar37 * local_448.x[0][3] + dVar31 * local_448.x[1][3] + local_448.x[3][3]
                        );
        fVar29 = local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar11];
        fVar1 = *(float *)((long)pVVar5 + lVar10 * 4 + -8);
        fVar2 = *(float *)((long)pVVar5 + lVar10 * 4 + -4);
        fVar3 = (&pVVar5->x)[lVar10];
        fVar41 = ((float)(dVar30 * local_448.x[2][0] +
                          dVar37 * local_448.x[0][0] + local_448.x[1][0] * dVar31 +
                         local_448.x[3][0]) / fVar35 - fVar1) * fVar29;
        fVar36 = ((float)(dVar30 * local_448.x[2][1] +
                          dVar37 * local_448.x[0][1] + local_448.x[1][1] * dVar31 +
                         local_448.x[3][1]) / fVar35 - fVar2) * fVar29;
        fVar29 = ((float)(dVar30 * local_448.x[2][2] +
                          dVar37 * local_448.x[0][2] + dVar31 * local_448.x[1][2] +
                         local_448.x[3][2]) / fVar35 - fVar3) * fVar29;
        dVar25 = dVar25 + (double)fVar41;
        dVar26 = dVar26 + (double)fVar36;
        dVar23 = dVar23 + (double)fVar29;
        dVar16 = dVar16 + (double)(fVar2 * fVar29 - fVar36 * fVar3);
        dVar18 = dVar18 + (double)(fVar3 * fVar41 - fVar29 * fVar1);
        dVar17 = dVar17 + (double)(fVar36 * fVar1 - fVar41 * fVar2);
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 3;
      } while (__n + (__n == 0) != lVar11);
    }
    if (0.0003452669770922512 <= dVar23 * dVar23 + dVar25 * dVar25 + dVar26 * dVar26) {
      __assert_fail("netForce.length2 () < eps",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0x100,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
    if (0.0003452669770922512 <= dVar17 * dVar17 + dVar16 * dVar16 + dVar18 * dVar18) {
      __assert_fail("netTorque.length2 () < eps",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0x101,
                    "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
                   );
    }
    if (local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_460.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("procrustesError (&from[0], &to[0], &weights[0], n, newMat) > procrustesError (&from[0], &to[0], &weights[0], n, ms)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                ,0xed,
                "void verifyProcrustes(const std::vector<Imath_3_2::Vec3<T>> &, const std::vector<Imath_3_2::Vec3<T>> &) [T = float]"
               );
}

Assistant:

void
verifyProcrustes (
    const std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>>& from,
    const std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>>& to)
{
    const T eps = std::sqrt (std::numeric_limits<T>::epsilon ());

    const size_t n = from.size ();

    // Validate that passing in uniform weights gives the same answer as
    // passing in no weights:
    std::vector<T> weights (from.size ());
    for (size_t i = 0; i < weights.size (); ++i)
        weights[i] = 1;
    IMATH_INTERNAL_NAMESPACE::M44d m1 =
        procrustesRotationAndTranslation (&from[0], &to[0], n);
    IMATH_INTERNAL_NAMESPACE::M44d m2 =
        procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], n);
    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            assert (std::abs (m1[i][j] - m2[i][j]) < eps);

    // Now try the weighted version:
    for (size_t i = 0; i < weights.size (); ++i)
        weights[i] = static_cast<T>(i + 1);

    IMATH_INTERNAL_NAMESPACE::M44d m =
        procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], n);

    // with scale:
    IMATH_INTERNAL_NAMESPACE::M44d ms = procrustesRotationAndTranslation (
        &from[0], &to[0], &weights[0], n, true);

    // Verify that it's orthonormal w/ positive determinant.
    const T det = static_cast<T>(m.determinant ());
    assert (std::abs (det - T (1)) < eps);

    // Verify orthonormal:
    IMATH_INTERNAL_NAMESPACE::M33d upperLeft;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            upperLeft[i][j] = m[i][j];
    IMATH_INTERNAL_NAMESPACE::M33d product =
        upperLeft * upperLeft.transposed ();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            const double expected = (i == j ? 1.0 : 0.0);
            assert (std::abs (product[i][j] - expected) < eps);
        }
    }

    // Verify that nearby transforms are worse:
    const size_t                     numTries = 10;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand (1056);
    const double                     delta = 1e-3;
    for (size_t i = 0; i < numTries; ++i)
    {
        // Construct an orthogonal rotation matrix using Euler angles:
        IMATH_INTERNAL_NAMESPACE::Eulerd diffRot (
            delta * rand.nextf (),
            delta * rand.nextf (),
            delta * rand.nextf ());

        assert (
            procrustesError (
                &from[0], &to[0], &weights[0], n, m * diffRot.toMatrix44 ()) >
            procrustesError (&from[0], &to[0], &weights[0], n, m));

        // Try a small translation:
        IMATH_INTERNAL_NAMESPACE::V3d diffTrans (
            delta * rand.nextf (),
            delta * rand.nextf (),
            delta * rand.nextf ());
        IMATH_INTERNAL_NAMESPACE::M44d translateMatrix;
        translateMatrix.translate (diffTrans);
        assert (
            procrustesError (
                &from[0], &to[0], &weights[0], n, m * translateMatrix) >
            procrustesError (&from[0], &to[0], &weights[0], n, m));
    }

    // Try a small scale:
    IMATH_INTERNAL_NAMESPACE::M44d newMat    = ms;
    const double                   scaleDiff = delta;
    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            newMat[i][j] = ms[i][j] * (1.0 + scaleDiff);
    assert (
        procrustesError (&from[0], &to[0], &weights[0], n, newMat) >
        procrustesError (&from[0], &to[0], &weights[0], n, ms));

    for (int i = 0; i < 3; ++i)
        for (int j = 0; j < 3; ++j)
            newMat[i][j] = ms[i][j] * (1.0 - scaleDiff);
    assert (
        procrustesError (&from[0], &to[0], &weights[0], n, newMat) >
        procrustesError (&from[0], &to[0], &weights[0], n, ms));

    //
    // Verify the magical property that makes shape springs work:
    // when the displacements Q*A-B, times the weights,
    // are applied as forces at B,
    // there is zero net force and zero net torque.
    //
    {
        IMATH_INTERNAL_NAMESPACE::V3d netForce (0);
        IMATH_INTERNAL_NAMESPACE::V3d netTorque (0);
        for (size_t iPoint = 0; iPoint < n; ++iPoint)
        {
            const IMATH_INTERNAL_NAMESPACE::V3d force =
                weights[iPoint] * (from[iPoint] * m - to[iPoint]);
            netForce += force;
            netTorque += to[iPoint].cross (force);
        }

        assert (netForce.length2 () < eps);
        assert (netTorque.length2 () < eps);
    }
}